

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O1

EVENT_TYPE validate_pc_signature(char *str_code)

{
  IDENTIFICATION_STRATEGY IVar1;
  int *__ptr;
  ulong uVar2;
  PcIdentifier *identifiers;
  EVENT_TYPE EVar3;
  IDENTIFICATION_STRATEGY strategy;
  long lVar4;
  long lVar5;
  bool bVar6;
  uint calc_identifiers_size;
  PcIdentifier user_identifiers [2];
  int identifiers_size;
  char base64ids [17];
  uint local_5c;
  int local_58;
  short local_54;
  undefined4 local_52;
  undefined2 local_4e;
  uint local_4c;
  char local_48 [4];
  undefined1 local_44 [4];
  undefined1 local_40 [4];
  undefined1 local_3c [12];
  
  local_5c = 0;
  __isoc99_sscanf(str_code,"%4s-%4s-%4s-%4s",local_48,local_44,local_40,local_3c);
  __ptr = (int *)unbase64(local_48,0x10,(int *)&local_4c);
  EVar3 = ENVIRONMENT_VARIABLE_NOT_DEFINED;
  if (local_4c < 0xd) {
    local_54 = (short)__ptr[1];
    local_58 = *__ptr;
    local_52 = *(undefined4 *)((long)__ptr + 6);
    local_4e = *(undefined2 *)((long)__ptr + 10);
    EVar3 = LICENSE_OK;
  }
  free(__ptr);
  if (local_4c < 0xd) {
    IVar1 = STRATEGY_UNKNOWN;
    identifiers = (PcIdentifier *)0x0;
    lVar5 = 0;
    do {
      strategy = (IDENTIFICATION_STRATEGY)(*(byte *)((long)&local_58 + lVar5 * 6) >> 5);
      if (strategy == STRATEGY_UNKNOWN) {
        EVar3 = LICENSE_MALFORMED;
        goto LAB_0020bfaa;
      }
      if (IVar1 != strategy) {
        if (identifiers != (PcIdentifier *)0x0) {
          free(identifiers);
        }
        generate_pc_id((PcIdentifier *)0x0,&local_5c,strategy);
        uVar2 = (ulong)local_5c;
        identifiers = (PcIdentifier *)malloc(uVar2 * 6);
        memset(identifiers,0,uVar2 * 6);
        generate_pc_id(identifiers,&local_5c,strategy);
        IVar1 = strategy;
      }
      if ((ulong)local_5c != 0) {
        lVar4 = 0;
        do {
          if (*(short *)(*identifiers + lVar4 + 4) == (&local_54)[lVar5 * 3] &&
              *(int *)(*identifiers + lVar4) == *(int *)((long)&local_58 + lVar5 * 6)) {
            EVar3 = LICENSE_OK;
            goto LAB_0020bfaa;
          }
          lVar4 = lVar4 + 6;
        } while ((ulong)local_5c * 6 != lVar4);
      }
      bVar6 = lVar5 == 0;
      lVar5 = lVar5 + 1;
    } while (bVar6);
    EVar3 = IDENTIFIERS_MISMATCH;
LAB_0020bfaa:
    free(identifiers);
  }
  return EVar3;
}

Assistant:

EVENT_TYPE validate_pc_signature(PcSignature str_code) {
	PcIdentifier user_identifiers[2];
	FUNCTION_RETURN result;
	IDENTIFICATION_STRATEGY previous_strategy_id, current_strategy_id;
	PcIdentifier* calculated_identifiers = NULL;
	unsigned int calc_identifiers_size = 0;
	int i = 0, j = 0;
	//bool found;
#ifdef _DEBUG
	printf("Comparing pc identifiers: \n");
#endif
	result = decode_pc_id(user_identifiers[0], user_identifiers[1], str_code);
	if (result != FUNC_RET_OK) {
		return result;
	}
	previous_strategy_id = STRATEGY_UNKNOWN;
	//found = false;
	for (i = 0; i < 2; i++) {
		current_strategy_id = strategy_from_pc_id(user_identifiers[i]);
		if (current_strategy_id == STRATEGY_UNKNOWN) {
			free(calculated_identifiers);
			return LICENSE_MALFORMED;
		}
		if (current_strategy_id != previous_strategy_id) {
			if (calculated_identifiers != NULL) {
				free(calculated_identifiers);
			}
			previous_strategy_id = current_strategy_id;
			generate_pc_id(NULL, &calc_identifiers_size, current_strategy_id);
			calculated_identifiers = (PcIdentifier *) malloc(
					sizeof(PcIdentifier) * calc_identifiers_size);
			memset(calculated_identifiers, 0, sizeof(PcIdentifier) * calc_identifiers_size);
			generate_pc_id(calculated_identifiers, &calc_identifiers_size,
					current_strategy_id);
		}
		//maybe skip the byte 0
		for (j = 0; j < calc_identifiers_size; j++) {
#ifdef _DEBUG
			printf("generated id: %02x%02x%02x%02x%02x%02x index %d, user_supplied id %02x%02x%02x%02x%02x%02x idx: %d\n",
					calculated_identifiers[j][0], calculated_identifiers[j][1], calculated_identifiers[j][2],
					calculated_identifiers[j][3], calculated_identifiers[j][4], calculated_identifiers[j][5], j,
					user_identifiers[i][0], user_identifiers[i][1], user_identifiers[i][2], user_identifiers[i][3], user_identifiers[i][4], user_identifiers[i][5], i);

#endif
			if (!memcmp(user_identifiers[i], calculated_identifiers[j],
					sizeof(PcIdentifier))) {
				free(calculated_identifiers);
				return LICENSE_OK;
			}
		}
	}
	free(calculated_identifiers);
	return IDENTIFIERS_MISMATCH;
}